

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall
cmMakefile::ExpandArguments
          (cmMakefile *this,vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *inArgs,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *outArgs)

{
  string_view arg;
  string *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  bool bVar1;
  cmListFileContext *pcVar2;
  size_type __n;
  reference __x;
  char *filename_00;
  cmListFileArgument *i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *__range1;
  string value;
  string *local_28;
  string *filename;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outArgs_local;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *inArgs_local;
  cmMakefile *this_local;
  
  filename = (string *)outArgs;
  outArgs_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)inArgs;
  inArgs_local = (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)this;
  GetBacktrace((cmMakefile *)&stack0xffffffffffffffc8);
  pcVar2 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                     ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)
                      &stack0xffffffffffffffc8);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&stack0xffffffffffffffc8);
  local_28 = &pcVar2->FilePath;
  std::__cxx11::string::string((string *)&__range1);
  this_00 = filename;
  __n = std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::size
                  ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)outArgs_local)
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_00,__n);
  this_01 = outArgs_local;
  __end1 = std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::begin
                     ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)
                      outArgs_local);
  i = (cmListFileArgument *)
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::end
                ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)this_01);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
                                     *)&i), bVar1) {
    __x = __gnu_cxx::
          __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
          ::operator*(&__end1);
    if (__x->Delim == Bracket) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)filename,&__x->Value);
    }
    else {
      std::__cxx11::string::operator=((string *)&__range1,(string *)__x);
      filename_00 = (char *)std::__cxx11::string::c_str();
      ExpandVariablesInString
                (this,(string *)&__range1,false,false,false,filename_00,__x->Line,false,false);
      if (__x->Delim == Quoted) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)filename,(value_type *)&__range1);
      }
      else {
        arg = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&__range1);
        cmExpandList(arg,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)filename,false);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
    ::operator++(&__end1);
  }
  bVar1 = cmSystemTools::GetFatalErrorOccurred();
  std::__cxx11::string::~string((string *)&__range1);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool cmMakefile::ExpandArguments(std::vector<cmListFileArgument> const& inArgs,
                                 std::vector<std::string>& outArgs) const
{
  std::string const& filename = this->GetBacktrace().Top().FilePath;
  std::string value;
  outArgs.reserve(inArgs.size());
  for (cmListFileArgument const& i : inArgs) {
    // No expansion in a bracket argument.
    if (i.Delim == cmListFileArgument::Bracket) {
      outArgs.push_back(i.Value);
      continue;
    }
    // Expand the variables in the argument.
    value = i.Value;
    this->ExpandVariablesInString(value, false, false, false, filename.c_str(),
                                  i.Line, false, false);

    // If the argument is quoted, it should be one argument.
    // Otherwise, it may be a list of arguments.
    if (i.Delim == cmListFileArgument::Quoted) {
      outArgs.push_back(value);
    } else {
      cmExpandList(value, outArgs);
    }
  }
  return !cmSystemTools::GetFatalErrorOccurred();
}